

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

QTextFrame * __thiscall QTextDocumentPrivate::frameAt(QTextDocumentPrivate *this,int pos)

{
  int iVar1;
  QTextFrame *this_00;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  QTextFrame *this_01;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextFrame_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = rootFrame(this);
  do {
    this_01 = this_00;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
    QTextFrame::childFrames((QList<QTextFrame_*> *)&local_58,this_01);
    uVar4 = local_58.size & 0xffffffff;
    iVar3 = 0;
    do {
      iVar5 = (int)uVar4 + -1;
      while( true ) {
        if (iVar5 < iVar3) {
          this_00 = (QTextFrame *)0x0;
          goto LAB_00462086;
        }
        uVar2 = (uint)(iVar5 + iVar3) >> 1;
        uVar4 = (ulong)uVar2;
        this_00 = local_58.ptr[uVar4];
        iVar1 = QTextFrame::lastPosition(this_00);
        if (pos <= iVar1) break;
        iVar3 = uVar2 + 1;
      }
      iVar5 = QTextFrame::firstPosition(this_00);
    } while (pos < iVar5);
LAB_00462086:
    QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer(&local_58);
    if (this_00 == (QTextFrame *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return this_01;
    }
  } while( true );
}

Assistant:

QTextFrame *QTextDocumentPrivate::frameAt(int pos) const
{
    QTextFrame *f = rootFrame();

    while (1) {
        QTextFrame *c = findChildFrame(f, pos);
        if (!c)
            return f;
        f = c;
    }
}